

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type
time_plain<trng::lagfib4plus<unsigned_long,3860u,7083u,11580u,19937u>>
          (lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *r)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  result_type rVar6;
  result_type rVar7;
  string res;
  string local_40;
  double local_20;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar5 = (ulong)(r->S).index;
  lVar3 = 0x1000000;
  rVar6 = 0;
  do {
    iVar1 = (int)uVar5;
    rVar7 = (r->S).r[iVar1 + 0x6456U & 0x7fff] + (r->S).r[iVar1 + 0x70edU & 0x7fff] +
            (r->S).r[iVar1 + 0x52c5U & 0x7fff] + (r->S).r[iVar1 + 0x3220U & 0x7fff];
    uVar4 = iVar1 + 1U & 0x7fff;
    uVar5 = (ulong)uVar4;
    (r->S).r[uVar5] = rVar7;
    rVar6 = rVar6 + rVar7;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  (r->S).index = uVar4;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar3 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar6;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}